

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O1

buffer_ptr_t __thiscall rudp::session::generate_ack(session *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer_ptr_t bVar2;
  
  peVar1 = (element_type *)operator_new(0x808);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)((peVar1->receive_buffer)._M_elems + 0x79) + 8) =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
  *(undefined4 *)
   &(((vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
       *)&peVar1->super_enable_shared_from_this<rudp::session>)->m_holder).
    super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage = 0;
  *(undefined2 *)
   ((long)&(((vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
              *)&peVar1->super_enable_shared_from_this<rudp::session>)->m_holder).
           super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage + 4) = 0;
  (this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
  super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<boost::container::static_vector<unsigned_char,2048ul,void>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
              super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (static_vector<unsigned_char,_2048UL,_void> *)peVar1);
  peVar1 = (this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
           super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((long)((peVar1->receive_buffer)._M_elems + 0x79) + 8) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined1 *)
     &(peVar1->super_enable_shared_from_this<rudp::session>)._M_weak_this.
      super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> = 0x40;
    peVar1 = (this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
             super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1 <
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         ((long)((peVar1->receive_buffer)._M_elems + 0x79) + 8)) {
      *(undefined1 *)
       ((long)&(peVar1->super_enable_shared_from_this<rudp::session>)._M_weak_this.
               super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> + 1) = 6;
      bVar2.
      super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = extraout_RDX._M_pi;
      bVar2.
      super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)this;
      return (buffer_ptr_t)
             bVar2.
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
  }
  __assert_fail("this->m_holder.m_size > n","/usr/include/boost/container/vector.hpp",0x644,
                "reference boost::container::vector<unsigned char, boost::container::dtl::static_storage_allocator<unsigned char, 2048, 0, true>>::operator[](size_type) [T = unsigned char, A = boost::container::dtl::static_storage_allocator<unsigned char, 2048, 0, true>, Options = void]"
               );
}

Assistant:

buffer_ptr_t session::generate_ack() {
    buffer_ptr_t buffer( new buffer_t( 6 ) );
    (*buffer)[ 0 ] = 0x40;
    (*buffer)[ 1 ] = 6;
    return buffer;
  }